

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

toml_type_t __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_date_or_number
          (parser_t<events_aggregator_t> *this)

{
  events_aggregator_t *this_00;
  char cVar1;
  int iVar2;
  uint uVar3;
  char *__end;
  parser_error_t *ppVar4;
  size_t sVar5;
  allocator local_611;
  string local_610;
  undefined1 local_5ea;
  allocator local_5e9;
  string local_5e8;
  double local_5c8;
  double result;
  char *end;
  string local_5b0;
  undefined1 local_58a;
  allocator local_589;
  string local_588;
  undefined1 local_562;
  allocator local_561;
  string local_560;
  ulong local_540;
  size_t exponent_size;
  size_t exponent_start;
  undefined1 local_528 [5];
  char first_digit;
  undefined1 local_502;
  allocator local_501;
  string local_500;
  char *local_4e0;
  char *it_1;
  char *it;
  int64_t result_1;
  string local_4c0;
  undefined1 local_49a;
  allocator local_499;
  string local_498;
  undefined1 local_472;
  allocator local_471;
  string local_470;
  undefined1 local_44a;
  allocator local_449;
  string local_448;
  undefined1 local_422;
  allocator local_421;
  string local_420;
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8;
  bool local_3d3;
  undefined1 local_3d2;
  allocator local_3d1;
  undefined1 local_3d0 [5];
  bool last_digit;
  allocator<char> local_399;
  string local_398;
  ulong local_378;
  size_t next_index;
  char *digits;
  char buffer [801];
  size_t value_offset;
  size_t max_double_length;
  char *min_int64_string;
  char *max_int64_string;
  size_t max_int64_digits;
  parser_t<events_aggregator_t> *this_local;
  
  register0x00000000 = input_stream_t::processed(&this->input);
  digits._0_1_ = '+';
  next_index = (long)&digits + 1;
  local_378 = 0;
  cVar1 = input_stream_t::peek(&this->input);
  iVar2 = isdigit((int)cVar1);
  if (iVar2 == 0) {
    cVar1 = input_stream_t::peek(&this->input);
    if (cVar1 == '-') {
      input_stream_t::get(&this->input);
      digits._0_1_ = '-';
    }
    else {
      cVar1 = input_stream_t::peek(&this->input);
      if (cVar1 != '+') {
        input_stream_t::get(&this->input);
        local_3d2 = 1;
        ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_3d0,"Unexpected character",&local_3d1);
        sVar5 = last_char_offset(this);
        parser_error_t::parser_error_t(ppVar4,(string *)local_3d0,sVar5);
        local_3d2 = 0;
        __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
      input_stream_t::get(&this->input);
    }
  }
  else {
    cVar1 = input_stream_t::get(&this->input);
    *(char *)(next_index + local_378) = cVar1;
    local_378 = local_378 + 1;
    cVar1 = input_stream_t::peek(&this->input);
    iVar2 = isdigit((int)cVar1);
    if (iVar2 != 0) {
      cVar1 = input_stream_t::get(&this->input);
      *(char *)(next_index + local_378) = cVar1;
      local_378 = local_378 + 1;
      cVar1 = input_stream_t::peek(&this->input);
      iVar2 = isdigit((int)cVar1);
      if (iVar2 != 0) {
        cVar1 = input_stream_t::get(&this->input);
        *(char *)(next_index + local_378) = cVar1;
        local_378 = local_378 + 1;
        cVar1 = input_stream_t::peek(&this->input);
        iVar2 = isdigit((int)cVar1);
        if (iVar2 != 0) {
          cVar1 = input_stream_t::get(&this->input);
          *(char *)(next_index + local_378) = cVar1;
          local_378 = local_378 + 1;
          cVar1 = input_stream_t::peek(&this->input);
          if (cVar1 == '-') {
            cVar1 = input_stream_t::get(&this->input);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_chars<2ul>(this,(char (*) [2])0x1f3b1e);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_chars<3ul>(this,(char (*) [3])"tT");
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_chars<2ul>(this,(char (*) [2])0x1fc456);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_chars<2ul>(this,(char (*) [2])0x1fc456);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = parse_datetime_digit(this);
            *(char *)(next_index + local_378) = cVar1;
            local_378 = local_378 + 1;
            cVar1 = input_stream_t::peek(&this->input);
            if (cVar1 == '.') {
              cVar1 = input_stream_t::get(&this->input);
              *(char *)(next_index + local_378) = cVar1;
              local_378 = local_378 + 1;
              cVar1 = parse_datetime_digit(this);
              *(char *)(next_index + local_378) = cVar1;
              while( true ) {
                local_378 = local_378 + 1;
                cVar1 = input_stream_t::peek(&this->input);
                iVar2 = isdigit((int)cVar1);
                if (iVar2 == 0) break;
                cVar1 = input_stream_t::get(&this->input);
                *(char *)(next_index + local_378) = cVar1;
              }
            }
            cVar1 = input_stream_t::peek(&this->input);
            if ((cVar1 == 'z') || (cVar1 = input_stream_t::peek(&this->input), cVar1 == 'Z')) {
              cVar1 = input_stream_t::get(&this->input);
              *(char *)(next_index + local_378) = cVar1;
            }
            else {
              cVar1 = parse_chars<3ul>(this,(char (*) [3])"+-");
              *(char *)(next_index + local_378) = cVar1;
              local_378 = local_378 + 1;
              cVar1 = parse_datetime_digit(this);
              *(char *)(next_index + local_378) = cVar1;
              local_378 = local_378 + 1;
              cVar1 = parse_datetime_digit(this);
              *(char *)(next_index + local_378) = cVar1;
              local_378 = local_378 + 1;
              cVar1 = parse_chars<2ul>(this,(char (*) [2])0x1fc456);
              *(char *)(next_index + local_378) = cVar1;
              local_378 = local_378 + 1;
              cVar1 = parse_datetime_digit(this);
              *(char *)(next_index + local_378) = cVar1;
              local_378 = local_378 + 1;
              cVar1 = parse_datetime_digit(this);
              *(char *)(next_index + local_378) = cVar1;
            }
            sVar5 = next_index;
            local_378 = local_378 + 1;
            this_00 = this->handler;
            __end = (char *)(next_index + local_378);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<char*,void>
                      ((string *)&local_398,(char *)sVar5,__end,&local_399);
            events_aggregator_t::datetime(this_00,&local_398);
            std::__cxx11::string::~string((string *)&local_398);
            std::allocator<char>::~allocator(&local_399);
            return datetime;
          }
        }
      }
    }
  }
  local_3d3 = local_378 != 0;
  while( true ) {
    while( true ) {
      if (local_378 == 800) {
        local_3fa = 1;
        ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3f8,"Number is too long",&local_3f9);
        sVar5 = last_char_offset(this);
        parser_error_t::parser_error_t(ppVar4,&local_3f8,sVar5);
        local_3fa = 0;
        __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
      cVar1 = input_stream_t::peek(&this->input);
      iVar2 = isdigit((int)cVar1);
      if (iVar2 == 0) break;
      cVar1 = input_stream_t::get(&this->input);
      *(char *)(next_index + local_378) = cVar1;
      local_3d3 = true;
      local_378 = local_378 + 1;
    }
    if (((local_3d3 & 1U) == 0) || (cVar1 = input_stream_t::peek(&this->input), cVar1 != '_'))
    break;
    input_stream_t::get(&this->input);
    local_3d3 = false;
  }
  if ((local_3d3 & 1U) == 0) {
    local_422 = 1;
    ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"Unexpected number end",&local_421);
    sVar5 = last_char_offset(this);
    parser_error_t::parser_error_t(ppVar4,&local_420,sVar5);
    local_422 = 0;
    __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
  }
  if ((*(char *)next_index == '0') && (1 < local_378)) {
    local_44a = 1;
    ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_448,"Leading zeros are not allowed",&local_449);
    sVar5 = input_stream_t::processed(&this->input);
    parser_error_t::parser_error_t(ppVar4,&local_448,sVar5 - local_378);
    local_44a = 0;
    __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
  }
  cVar1 = input_stream_t::peek(&this->input);
  if (((cVar1 == '.') || (cVar1 = input_stream_t::peek(&this->input), cVar1 == 'e')) ||
     (cVar1 = input_stream_t::peek(&this->input), cVar1 == 'E')) {
    cVar1 = input_stream_t::peek(&this->input);
    if (cVar1 == '.') {
      *(undefined1 *)(next_index + local_378) = 0x2e;
      local_378 = local_378 + 1;
      input_stream_t::get(&this->input);
      local_3d3 = false;
      while( true ) {
        while( true ) {
          if (local_378 == 800) {
            local_502 = 1;
            ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_500,"Number is too long",&local_501);
            sVar5 = last_char_offset(this);
            parser_error_t::parser_error_t(ppVar4,&local_500,sVar5);
            local_502 = 0;
            __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
          }
          cVar1 = input_stream_t::peek(&this->input);
          iVar2 = isdigit((int)cVar1);
          if (iVar2 == 0) break;
          cVar1 = input_stream_t::get(&this->input);
          *(char *)(next_index + local_378) = cVar1;
          local_3d3 = true;
          local_378 = local_378 + 1;
        }
        if (((local_3d3 & 1U) == 0) || (cVar1 = input_stream_t::peek(&this->input), cVar1 != '_'))
        break;
        input_stream_t::get(&this->input);
        local_3d3 = false;
      }
      if ((local_3d3 & 1U) == 0) {
        exponent_start._6_1_ = 1;
        ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_528,"Unexpected number end",
                   (allocator *)((long)&exponent_start + 7));
        sVar5 = last_char_offset(this);
        parser_error_t::parser_error_t(ppVar4,(string *)local_528,sVar5);
        exponent_start._6_1_ = 0;
        __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
    }
    cVar1 = input_stream_t::peek(&this->input);
    if ((cVar1 == 'e') || (cVar1 = input_stream_t::peek(&this->input), cVar1 == 'E')) {
      cVar1 = input_stream_t::get(&this->input);
      *(char *)(next_index + local_378) = cVar1;
      local_378 = local_378 + 1;
      cVar1 = input_stream_t::peek(&this->input);
      if ((cVar1 == '+') || (cVar1 = input_stream_t::peek(&this->input), cVar1 == '-')) {
        cVar1 = input_stream_t::get(&this->input);
        *(char *)(next_index + local_378) = cVar1;
        local_378 = local_378 + 1;
      }
      exponent_start._5_1_ = input_stream_t::peek(&this->input);
      exponent_size = input_stream_t::processed(&this->input);
      local_540 = 0;
      local_3d3 = false;
      while( true ) {
        while( true ) {
          if (local_378 == 800) {
            local_562 = 1;
            ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_560,"Number is too long",&local_561);
            sVar5 = last_char_offset(this);
            parser_error_t::parser_error_t(ppVar4,&local_560,sVar5);
            local_562 = 0;
            __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
          }
          cVar1 = input_stream_t::peek(&this->input);
          iVar2 = isdigit((int)cVar1);
          if (iVar2 == 0) break;
          cVar1 = input_stream_t::get(&this->input);
          *(char *)(next_index + local_378) = cVar1;
          local_3d3 = true;
          local_540 = local_540 + 1;
          local_378 = local_378 + 1;
        }
        if (((local_3d3 & 1U) == 0) || (cVar1 = input_stream_t::peek(&this->input), cVar1 != '_'))
        break;
        input_stream_t::get(&this->input);
        local_3d3 = false;
      }
      if ((local_3d3 & 1U) == 0) {
        local_58a = 1;
        ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_588,"Unexpected number end",&local_589);
        sVar5 = last_char_offset(this);
        parser_error_t::parser_error_t(ppVar4,&local_588,sVar5);
        local_58a = 0;
        __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
      if ((1 < local_540) && (exponent_start._5_1_ == '0')) {
        end._6_1_ = 1;
        ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_5b0,"Leading zeros are not allowed in exponent",
                   (allocator *)((long)&end + 7));
        parser_error_t::parser_error_t(ppVar4,&local_5b0,exponent_size);
        end._6_1_ = 0;
        __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
    }
    *(undefined1 *)(next_index + local_378) = 0;
    result = 0.0;
    local_5c8 = strtod((char *)&digits,(char **)&result);
    if (result != (double)(next_index + local_378)) {
      local_5ea = 1;
      ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5e8,"Bad number",&local_5e9);
      parser_error_t::parser_error_t(ppVar4,&local_5e8,stack0xffffffffffffffc0);
      local_5ea = 0;
      __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    uVar3 = std::isnan(local_5c8);
    if (((uVar3 & 1) != 0) || (uVar3 = std::isinf(local_5c8), (uVar3 & 1) != 0)) {
      ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_610,
                 "The number can not be represented as 64-bit floating point number",&local_611);
      parser_error_t::parser_error_t(ppVar4,&local_610,stack0xffffffffffffffc0);
      __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    events_aggregator_t::floating_point(this->handler,local_5c8);
    this_local._4_4_ = floating_point;
  }
  else {
    if (local_378 == 0x13) {
      if (((char)digits == '-') &&
         (iVar2 = strncmp((char *)next_index,"9223372036854775808",0x13), 0 < iVar2)) {
        local_472 = 1;
        ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_470,"The number cannot be represented as 64-bit signed integer",
                   &local_471);
        parser_error_t::parser_error_t(ppVar4,&local_470,stack0xffffffffffffffc0);
        local_472 = 0;
        __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
      if (((char)digits != '-') &&
         (iVar2 = strncmp((char *)next_index,"9223372036854775807",0x13), 0 < iVar2)) {
        local_49a = 1;
        ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_498,"The number cannot be represented as 64-bit signed integer",
                   &local_499);
        parser_error_t::parser_error_t(ppVar4,&local_498,stack0xffffffffffffffc0);
        local_49a = 0;
        __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
    }
    else if (0x13 < local_378) {
      result_1._6_1_ = 1;
      ppVar4 = (parser_error_t *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_4c0,"The number cannot be represented as 64-bit signed integer",
                 (allocator *)((long)&result_1 + 7));
      parser_error_t::parser_error_t(ppVar4,&local_4c0,stack0xffffffffffffffc0);
      result_1._6_1_ = 0;
      __cxa_throw(ppVar4,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    it = (char *)0x0;
    if ((char)digits == '-') {
      for (it_1 = (char *)next_index; it_1 < (char *)(next_index + local_378); it_1 = it_1 + 1) {
        it = (char *)((long)it * 10 - (long)(*it_1 + -0x30));
      }
    }
    else {
      for (local_4e0 = (char *)next_index; local_4e0 < (char *)(next_index + local_378);
          local_4e0 = local_4e0 + 1) {
        it = (char *)((long)it * 10 + (long)(*local_4e0 + -0x30));
      }
    }
    events_aggregator_t::integer(this->handler,(int64_t)it);
    this_local._4_4_ = integer;
  }
  return this_local._4_4_;
}

Assistant:

toml_type_t parse_date_or_number() {
        const std::size_t max_int64_digits = 19;
        const char *max_int64_string = "9223372036854775807";
        const char *min_int64_string = "9223372036854775808";

        const std::size_t max_double_length = 800;

        std::size_t value_offset = input.processed();

        char buffer[max_double_length + 1];
        buffer[0] = '+';
        char *digits = buffer + 1;

        std::size_t next_index = 0;

        if (std::isdigit(input.peek())) {
            digits[next_index++] = input.get();
            if (std::isdigit(input.peek())) {
                digits[next_index++] = input.get();
                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    if (std::isdigit(input.peek())) {
                        digits[next_index++] = input.get();

                        if (input.peek() == '-') {
                            digits[next_index++] = input.get();

                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars("-");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars("tT");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars(":");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars(":");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();

                            if (input.peek() == '.') {
                                digits[next_index++] = input.get();
                                digits[next_index++] = parse_datetime_digit();

                                while (std::isdigit(input.peek())) {
                                    digits[next_index++] = input.get();
                                }
                            }

                            if (input.peek() == 'z' || input.peek() == 'Z') {
                                digits[next_index++] = input.get();
                            } else {
                                digits[next_index++] = parse_chars("+-");
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_chars(":");
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_datetime_digit();
                            }

                            handler.datetime(std::string(digits, digits + next_index));
                            return toml_type_t::datetime;
                        }
                    }
                }
            }
        } else if (input.peek() == '-') {
            input.get();
            buffer[0] = '-';
        } else if (input.peek() == '+') {
            input.get();
        } else {
            input.get();
            throw parser_error_t("Unexpected character", last_char_offset());
        }

        bool last_digit = next_index > 0;
        while (true) {
            if (next_index == max_double_length) {
                throw parser_error_t("Number is too long", last_char_offset());
            }

            if (std::isdigit(input.peek())) {
                digits[next_index++] = input.get();
                last_digit = true;
            } else if (last_digit && input.peek() == '_') {
                input.get();
                last_digit = false;
            } else {
                break;
            }
        }

        if (!last_digit) {
            throw parser_error_t("Unexpected number end", last_char_offset());
        }

        if (digits[0] == '0' && next_index > 1) {
            throw parser_error_t("Leading zeros are not allowed", input.processed() - next_index);
        }

        if (input.peek() != '.' && input.peek() != 'e' && input.peek() != 'E') {
            if (next_index == max_int64_digits)
            {
                if (buffer[0] == '-' && strncmp(digits, min_int64_string, max_int64_digits) > 0) {
                    throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                         value_offset);
                }

                if (buffer[0] != '-' && strncmp(digits, max_int64_string, max_int64_digits) > 0) {
                    throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                         value_offset);
                }
            } else if (next_index > max_int64_digits) {
                throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                     value_offset);
            }

            std::int64_t result = 0;

            if (buffer[0] == '-') {
                for (auto it = digits; it < digits + next_index; ++it) {
                    result = 10 * result - (*it - '0');
                }
            } else {
                for (auto it = digits; it < digits + next_index; ++it) {
                    result = 10 * result + (*it - '0');
                }
            }

            handler.integer(result);
            return toml_type_t::integer;
        }

        if (input.peek() == '.') {
            digits[next_index++] = '.';
            input.get();

            last_digit = false;
            while (true) {
                if (next_index == max_double_length) {
                    throw parser_error_t("Number is too long", last_char_offset());
                }

                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    last_digit = true;
                } else if (last_digit && input.peek() == '_') {
                    input.get();
                    last_digit = false;
                } else {
                    break;
                }
            }

            if (!last_digit) {
                throw parser_error_t("Unexpected number end", last_char_offset());
            }
        }

        if (input.peek() == 'e' || input.peek() == 'E') {
            digits[next_index++] = input.get();

            if (input.peek() == '+' || input.peek() == '-') {
                digits[next_index++] = input.get();
            }

            char first_digit = input.peek();
            std::size_t exponent_start = input.processed();
            std::size_t exponent_size = 0;
            last_digit = false;
            while (true) {
                if (next_index == max_double_length) {
                    throw parser_error_t("Number is too long", last_char_offset());
                }

                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    last_digit = true;
                    ++exponent_size;
                } else if (last_digit && input.peek() == '_') {
                    input.get();
                    last_digit = false;
                } else {
                    break;
                }
            }

            if (!last_digit) {
                throw parser_error_t("Unexpected number end", last_char_offset());
            }

            if (exponent_size > 1 && first_digit == '0') {
                throw parser_error_t("Leading zeros are not allowed in exponent", exponent_start);
            }
        }

        digits[next_index] = '\0';
        char *end = nullptr;
        double result = std::strtod(buffer, &end);

        if (end != digits + next_index) {
            throw parser_error_t("Bad number", value_offset);
        }

        if (std::isnan(result) || std::isinf(result)) {
            throw parser_error_t("The number can not be represented as 64-bit floating point number",
                                 value_offset);
        }

        handler.floating_point(result);
        return toml_type_t::floating_point;
    }